

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_udot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  long *plVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uintptr_t i;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar7 = (ulong)uVar2;
  iVar8 = (int)desc >> 10;
  for (uVar9 = 0; uVar9 < uVar2 >> 3; uVar9 = uVar9 + 2) {
    uVar10 = (ulong)*(ushort *)((long)vm + uVar9 * 8 + (long)iVar8 * 8);
    uVar13 = (ulong)*(ushort *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 2);
    uVar11 = (ulong)*(ushort *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 4);
    uVar12 = (ulong)*(ushort *)((long)vm + uVar9 * 8 + (long)iVar8 * 8 + 6);
    uVar3 = *(ushort *)((long)vn + uVar9 * 8 + 8);
    uVar4 = *(ushort *)((long)vn + uVar9 * 8 + 10);
    uVar5 = *(ushort *)((long)vn + uVar9 * 8 + 0xc);
    uVar6 = *(ushort *)((long)vn + uVar9 * 8 + 0xe);
    plVar1 = (long *)((long)vd + uVar9 * 8);
    *plVar1 = *plVar1 + *(ushort *)((long)vn + uVar9 * 8 + 6) * uVar12 +
                        *(ushort *)((long)vn + uVar9 * 8 + 4) * uVar11 +
                        *(ushort *)((long)vn + uVar9 * 8 + 2) * uVar13 +
                        *(ushort *)((long)vn + uVar9 * 8) * uVar10;
    plVar1 = (long *)((long)vd + uVar9 * 8 + 8);
    *plVar1 = *plVar1 + uVar6 * uVar12 + uVar5 * uVar11 + uVar4 * uVar13 + uVar3 * uVar10;
  }
  for (; uVar7 < (desc >> 2 & 0xf8) + 8; uVar7 = uVar7 + 8) {
    *(undefined8 *)((long)vd + uVar7) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_udot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    uint16_t *n = vn;
    uint16_t *m_indexed = (uint16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (uint64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (uint64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (uint64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (uint64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (uint64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (uint64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (uint64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (uint64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}